

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

int Gia_ManDupOrderDfs_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int iLit1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  Gia_Man_t *pNew_local;
  
  if (pObj->Value == 0xffffffff) {
    iVar1 = Gia_ObjIsCi(pObj);
    if (iVar1 == 0) {
      pGVar2 = Gia_ObjFanin0(pObj);
      Gia_ManDupOrderDfs_rec(pNew,p,pGVar2);
      iVar1 = Gia_ObjIsCo(pObj);
      if (iVar1 == 0) {
        pGVar2 = Gia_ObjFanin1(pObj);
        Gia_ManDupOrderDfs_rec(pNew,p,pGVar2);
        iVar1 = Gia_ObjFanin0Copy(pObj);
        iLit1 = Gia_ObjFanin1Copy(pObj);
        pNew_local._4_4_ = Gia_ManAppendAnd(pNew,iVar1,iLit1);
        pObj->Value = pNew_local._4_4_;
      }
      else {
        iVar1 = Gia_ObjFanin0Copy(pObj);
        pNew_local._4_4_ = Gia_ManAppendCo(pNew,iVar1);
        pObj->Value = pNew_local._4_4_;
      }
    }
    else {
      pNew_local._4_4_ = Gia_ManAppendCi(pNew);
      pObj->Value = pNew_local._4_4_;
    }
  }
  else {
    pNew_local._4_4_ = pObj->Value;
  }
  return pNew_local._4_4_;
}

Assistant:

int Gia_ManDupOrderDfs_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( ~pObj->Value )
        return pObj->Value;
    if ( Gia_ObjIsCi(pObj) )
        return pObj->Value = Gia_ManAppendCi(pNew);
//    if ( p->pNexts && Gia_ObjNext(p, Gia_ObjId(p, pObj)) )
//        Gia_ManDupOrderDfs_rec( pNew, p, Gia_ObjNextObj(p, Gia_ObjId(p, pObj)) );
    Gia_ManDupOrderDfs_rec( pNew, p, Gia_ObjFanin0(pObj) );
    if ( Gia_ObjIsCo(pObj) )
        return pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManDupOrderDfs_rec( pNew, p, Gia_ObjFanin1(pObj) );
    return pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
}